

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectInterfacePerModule.h
# Opt level: O2

void __thiscall
TObjectConstructorConcrete<TActual<TestSharedPtrObj>_>::DeRegister
          (TObjectConstructorConcrete<TActual<TestSharedPtrObj>_> *this,PerTypeObjectId id)

{
  pointer ppIVar1;
  PerTypeObjectId local_18;
  
  ppIVar1 = (this->m_ConstructedObjects).
            super__Vector_base<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (((long)ppIVar1 -
       (long)(this->m_ConstructedObjects).
             super__Vector_base<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>._M_impl
             .super__Vector_impl_data._M_start >> 3) - 1U == id) {
    (this->m_ConstructedObjects).
    super__Vector_base<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar1 + -1;
  }
  else {
    local_18 = id;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->m_FreeIds,&local_18);
    (this->m_ConstructedObjects).
    super__Vector_base<IObjectSharedState_*,_std::allocator<IObjectSharedState_*>_>._M_impl.
    super__Vector_impl_data._M_start[local_18] = (IObjectSharedState *)0x0;
  }
  return;
}

Assistant:

void DeRegister( PerTypeObjectId id )
    {
        //remove from constructed objects.
        //use swap with last one
        if( m_ConstructedObjects.size() - 1 == id )
        {
            //it's the last one, just remove it.
            m_ConstructedObjects.pop_back();
        }
        else
        {
            m_FreeIds.push_back( id );
            m_ConstructedObjects[ id ] = 0;
        }
    }